

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool google::protobuf::FileDescriptorProto::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = internal::AllAreInitialized<google::protobuf::DescriptorProto>
                    ((RepeatedPtrField<google::protobuf::DescriptorProto> *)(msg + 3));
  if ((((bVar1) &&
       (bVar1 = internal::AllAreInitialized<google::protobuf::EnumDescriptorProto>
                          ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                           &msg[4]._internal_metadata_), bVar1)) &&
      (bVar1 = internal::AllAreInitialized<google::protobuf::ServiceDescriptorProto>
                         ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)(msg + 6)),
      bVar1)) &&
     (bVar1 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>
                        ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                         &msg[7]._internal_metadata_), bVar1)) {
    uVar2 = *(uint *)&msg[1]._vptr_MessageLite;
    if ((uVar2 & 8) != 0) {
      bVar1 = FileOptions::IsInitializedImpl((MessageLite *)msg[0xe]._vptr_MessageLite);
      if (!bVar1) {
        return false;
      }
      uVar2 = *(uint *)&msg[1]._vptr_MessageLite;
    }
    if (((uVar2 & 0x10) == 0) ||
       (bVar1 = SourceCodeInfo::IsInitializedImpl((MessageLite *)msg[0xe]._internal_metadata_.ptr_),
       bVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

PROTOBUF_NOINLINE bool FileDescriptorProto::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FileDescriptorProto&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_message_type()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_enum_type()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_service()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_extension()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000008u) != 0) {
    if (!this_._impl_.options_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000010u) != 0) {
    if (!this_._impl_.source_code_info_->IsInitialized()) return false;
  }
  return true;
}